

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_ApproximateSizes::_Run(_Test_ApproximateSizes *this)

{
  bool bVar1;
  uint64_t uVar2;
  DBImpl *this_00;
  int local_18e0;
  int local_18dc;
  Tester local_18d8;
  int local_1738;
  int local_1734;
  Tester local_1730;
  undefined1 local_1590 [8];
  Slice cend;
  Slice cstart;
  string cend_str;
  leveldb local_1550 [8];
  string cstart_str;
  leveldb local_1530 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1510 [32];
  Slice local_14f0;
  Slice local_14e0;
  Tester local_14d0;
  leveldb local_1330 [32];
  Slice local_1310;
  Slice local_1300;
  Tester local_12f0;
  leveldb local_1150 [32];
  Slice local_1130;
  leveldb local_1120 [32];
  Slice local_1100;
  Tester local_10f0;
  leveldb local_f50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f30 [32];
  Slice local_f10;
  Slice local_f00;
  Tester local_ef0;
  leveldb local_d50 [32];
  Slice local_d30;
  Slice local_d20;
  Tester local_d10;
  int local_b6c;
  int local_b68;
  int i_1;
  int compact_start;
  int run;
  Slice local_b40;
  Slice local_b30;
  Tester local_b20;
  leveldb local_980 [32];
  Slice local_960;
  Slice local_950;
  Tester local_940;
  leveldb local_7a0 [32];
  leveldb local_780 [32];
  undefined1 local_760 [428];
  int local_5b4;
  Random local_5b0;
  int i;
  Random rnd;
  int N;
  Tester local_5a0;
  Slice local_400;
  Slice local_3f0;
  Tester local_3e0;
  Slice local_240 [2];
  Slice local_220;
  Tester local_210;
  undefined1 local_70 [8];
  Options options;
  _Test_ApproximateSizes *this_local;
  
  options.filter_policy = (FilterPolicy *)this;
  do {
    DBTest::CurrentOptions((Options *)local_70,&this->super_DBTest);
    options.info_log = (Logger *)0x5f5e100;
    options.max_file_size._0_4_ = 0;
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
    test::Tester::Tester
              (&local_210,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x49a);
    Slice::Slice(&local_220,"");
    Slice::Slice(local_240,"xyz");
    uVar2 = DBTest::Size(&this->super_DBTest,&local_220,local_240);
    bVar1 = Between(uVar2,0,0);
    test::Tester::Is(&local_210,bVar1,"Between(Size(\"\", \"xyz\"), 0, 0)");
    test::Tester::~Tester(&local_210);
    DBTest::Reopen(&this->super_DBTest,(Options *)local_70);
    test::Tester::Tester
              (&local_3e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x49c);
    Slice::Slice(&local_3f0,"");
    Slice::Slice(&local_400,"xyz");
    uVar2 = DBTest::Size(&this->super_DBTest,&local_3f0,&local_400);
    bVar1 = Between(uVar2,0,0);
    test::Tester::Is(&local_3e0,bVar1,"Between(Size(\"\", \"xyz\"), 0, 0)");
    test::Tester::~Tester(&local_3e0);
    test::Tester::Tester
              (&local_5a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x49f);
    N = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
    rnd.seed_ = 0;
    test::Tester::IsEq<int,int>(&local_5a0,&N,(int *)&rnd);
    test::Tester::~Tester(&local_5a0);
    i = 0x50;
    Random::Random(&local_5b0,0x12d);
    for (local_5b4 = 0; local_5b4 < 0x50; local_5b4 = local_5b4 + 1) {
      test::Tester::Tester
                ((Tester *)(local_760 + 8),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                 ,0x4a5);
      Key_abi_cxx11_(local_780,local_5b4);
      RandomString_abi_cxx11_(local_7a0,&local_5b0,100000);
      DBTest::Put((DBTest *)local_760,(string *)this,(string *)local_780);
      test::Tester::IsOk((Tester *)(local_760 + 8),(Status *)local_760);
      Status::~Status((Status *)local_760);
      std::__cxx11::string::~string((string *)local_7a0);
      std::__cxx11::string::~string((string *)local_780);
      test::Tester::~Tester((Tester *)(local_760 + 8));
    }
    test::Tester::Tester
              (&local_940,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x4a9);
    Slice::Slice(&local_950,"");
    Key_abi_cxx11_(local_980,0x32);
    Slice::Slice(&local_960,(string *)local_980);
    uVar2 = DBTest::Size(&this->super_DBTest,&local_950,&local_960);
    bVar1 = Between(uVar2,0,0);
    test::Tester::Is(&local_940,bVar1,"Between(Size(\"\", Key(50)), 0, 0)");
    std::__cxx11::string::~string((string *)local_980);
    test::Tester::~Tester(&local_940);
    if ((options.max_file_size._4_1_ & 1) == 0) {
      for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
        DBTest::Reopen(&this->super_DBTest,(Options *)local_70);
        for (local_b68 = 0; local_b68 < 0x50; local_b68 = local_b68 + 10) {
          for (local_b6c = 0; local_b6c < 0x50; local_b6c = local_b6c + 10) {
            test::Tester::Tester
                      (&local_d10,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                       ,0x4b9);
            Slice::Slice(&local_d20,"");
            Key_abi_cxx11_(local_d50,local_b6c);
            Slice::Slice(&local_d30,(string *)local_d50);
            uVar2 = DBTest::Size(&this->super_DBTest,&local_d20,&local_d30);
            bVar1 = Between(uVar2,(long)(local_b6c * 100000),(long)(local_b6c * 0x19a28));
            test::Tester::Is(&local_d10,bVar1,"Between(Size(\"\", Key(i)), S1 * i, S2 * i)");
            std::__cxx11::string::~string((string *)local_d50);
            test::Tester::~Tester(&local_d10);
            test::Tester::Tester
                      (&local_ef0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                       ,0x4bb);
            Slice::Slice(&local_f00,"");
            Key_abi_cxx11_(local_f50,local_b6c);
            std::operator+(local_f30,(char *)local_f50);
            Slice::Slice(&local_f10,local_f30);
            uVar2 = DBTest::Size(&this->super_DBTest,&local_f00,&local_f10);
            bVar1 = Between(uVar2,(long)((local_b6c + 1) * 100000),(long)((local_b6c + 1) * 0x19a28)
                           );
            test::Tester::Is(&local_ef0,bVar1,
                             "Between(Size(\"\", Key(i) + \".suffix\"), S1 * (i + 1), S2 * (i + 1))"
                            );
            std::__cxx11::string::~string((string *)local_f30);
            std::__cxx11::string::~string((string *)local_f50);
            test::Tester::~Tester(&local_ef0);
            test::Tester::Tester
                      (&local_10f0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                       ,0x4bc);
            Key_abi_cxx11_(local_1120,local_b6c);
            Slice::Slice(&local_1100,(string *)local_1120);
            Key_abi_cxx11_(local_1150,local_b6c + 10);
            Slice::Slice(&local_1130,(string *)local_1150);
            uVar2 = DBTest::Size(&this->super_DBTest,&local_1100,&local_1130);
            bVar1 = Between(uVar2,1000000,0x100590);
            test::Tester::Is(&local_10f0,bVar1,
                             "Between(Size(Key(i), Key(i + 10)), S1 * 10, S2 * 10)");
            std::__cxx11::string::~string((string *)local_1150);
            std::__cxx11::string::~string((string *)local_1120);
            test::Tester::~Tester(&local_10f0);
          }
          test::Tester::Tester
                    (&local_12f0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                     ,0x4be);
          Slice::Slice(&local_1300,"");
          Key_abi_cxx11_(local_1330,0x32);
          Slice::Slice(&local_1310,(string *)local_1330);
          uVar2 = DBTest::Size(&this->super_DBTest,&local_1300,&local_1310);
          bVar1 = Between(uVar2,5000000,0x501bd0);
          test::Tester::Is(&local_12f0,bVar1,"Between(Size(\"\", Key(50)), S1 * 50, S2 * 50)");
          std::__cxx11::string::~string((string *)local_1330);
          test::Tester::~Tester(&local_12f0);
          test::Tester::Tester
                    (&local_14d0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                     ,0x4bf);
          Slice::Slice(&local_14e0,"");
          Key_abi_cxx11_(local_1530,0x32);
          std::operator+(local_1510,(char *)local_1530);
          Slice::Slice(&local_14f0,local_1510);
          uVar2 = DBTest::Size(&this->super_DBTest,&local_14e0,&local_14f0);
          bVar1 = Between(uVar2,5000000,0x501bd0);
          test::Tester::Is(&local_14d0,bVar1,
                           "Between(Size(\"\", Key(50) + \".suffix\"), S1 * 50, S2 * 50)");
          std::__cxx11::string::~string((string *)local_1510);
          std::__cxx11::string::~string((string *)local_1530);
          test::Tester::~Tester(&local_14d0);
          Key_abi_cxx11_(local_1550,local_b68);
          Key_abi_cxx11_((leveldb *)&cstart.size_,local_b68 + 9);
          Slice::Slice((Slice *)&cend.size_,(string *)local_1550);
          Slice::Slice((Slice *)local_1590,(string *)&cstart.size_);
          this_00 = DBTest::dbfull(&this->super_DBTest);
          DBImpl::TEST_CompactRange(this_00,0,(Slice *)&cend.size_,(Slice *)local_1590);
          std::__cxx11::string::~string((string *)&cstart.size_);
          std::__cxx11::string::~string((string *)local_1550);
        }
        test::Tester::Tester
                  (&local_1730,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                   ,0x4c8);
        local_1734 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
        local_1738 = 0;
        test::Tester::IsEq<int,int>(&local_1730,&local_1734,&local_1738);
        test::Tester::~Tester(&local_1730);
        test::Tester::Tester
                  (&local_18d8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                   ,0x4c9);
        local_18dc = DBTest::NumTableFilesAtLevel(&this->super_DBTest,1);
        local_18e0 = 0;
        test::Tester::IsGt<int,int>(&local_18d8,&local_18dc,&local_18e0);
        test::Tester::~Tester(&local_18d8);
      }
    }
    else {
      DBTest::Reopen(&this->super_DBTest,(Options *)local_70);
      test::Tester::Tester
                (&local_b20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                 ,0x4af);
      Slice::Slice(&local_b30,"");
      Key_abi_cxx11_((leveldb *)&compact_start,0x32);
      Slice::Slice(&local_b40,(string *)&compact_start);
      uVar2 = DBTest::Size(&this->super_DBTest,&local_b30,&local_b40);
      bVar1 = Between(uVar2,0,0);
      test::Tester::Is(&local_b20,bVar1,"Between(Size(\"\", Key(50)), 0, 0)");
      std::__cxx11::string::~string((string *)&compact_start);
      test::Tester::~Tester(&local_b20);
    }
    bVar1 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar1);
  return;
}

Assistant:

TEST(DBTest, ApproximateSizes) {
  do {
    Options options = CurrentOptions();
    options.write_buffer_size = 100000000;  // Large write buffer
    options.compression = kNoCompression;
    DestroyAndReopen();

    ASSERT_TRUE(Between(Size("", "xyz"), 0, 0));
    Reopen(&options);
    ASSERT_TRUE(Between(Size("", "xyz"), 0, 0));

    // Write 8MB (80 values, each 100K)
    ASSERT_EQ(NumTableFilesAtLevel(0), 0);
    const int N = 80;
    static const int S1 = 100000;
    static const int S2 = 105000;  // Allow some expansion from metadata
    Random rnd(301);
    for (int i = 0; i < N; i++) {
      ASSERT_OK(Put(Key(i), RandomString(&rnd, S1)));
    }

    // 0 because GetApproximateSizes() does not account for memtable space
    ASSERT_TRUE(Between(Size("", Key(50)), 0, 0));

    if (options.reuse_logs) {
      // Recovery will reuse memtable, and GetApproximateSizes() does not
      // account for memtable usage;
      Reopen(&options);
      ASSERT_TRUE(Between(Size("", Key(50)), 0, 0));
      continue;
    }

    // Check sizes across recovery by reopening a few times
    for (int run = 0; run < 3; run++) {
      Reopen(&options);

      for (int compact_start = 0; compact_start < N; compact_start += 10) {
        for (int i = 0; i < N; i += 10) {
          ASSERT_TRUE(Between(Size("", Key(i)), S1 * i, S2 * i));
          ASSERT_TRUE(Between(Size("", Key(i) + ".suffix"), S1 * (i + 1),
                              S2 * (i + 1)));
          ASSERT_TRUE(Between(Size(Key(i), Key(i + 10)), S1 * 10, S2 * 10));
        }
        ASSERT_TRUE(Between(Size("", Key(50)), S1 * 50, S2 * 50));
        ASSERT_TRUE(Between(Size("", Key(50) + ".suffix"), S1 * 50, S2 * 50));

        std::string cstart_str = Key(compact_start);
        std::string cend_str = Key(compact_start + 9);
        Slice cstart = cstart_str;
        Slice cend = cend_str;
        dbfull()->TEST_CompactRange(0, &cstart, &cend);
      }

      ASSERT_EQ(NumTableFilesAtLevel(0), 0);
      ASSERT_GT(NumTableFilesAtLevel(1), 0);
    }
  } while (ChangeOptions());
}